

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_greedy_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  BYTE *pBVar2;
  undefined8 *puVar3;
  U32 UVar4;
  U32 *pUVar5;
  undefined8 uVar6;
  U32 lowestValid;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  ulong *puVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  ulong *ip;
  ulong uVar15;
  ulong *puVar16;
  BYTE *pBVar17;
  int iVar18;
  ulong uVar19;
  ulong *puVar20;
  long lVar21;
  seqDef *psVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  ulong *puVar26;
  ulong *puVar27;
  uint uVar28;
  BYTE *litEnd;
  ulong uVar29;
  BYTE *pInLoopLimit;
  size_t offbaseFound;
  BYTE *litLimit_w;
  size_t local_b0;
  uint local_a4;
  ulong *local_a0;
  ulong *local_98;
  BYTE *local_90;
  uint local_84;
  ulong *local_80;
  ulong local_78;
  ulong local_70;
  uint local_64;
  uint local_60;
  uint local_5c;
  BYTE *local_58;
  ulong *local_50;
  ulong *local_48;
  uint *local_40;
  ulong local_38;
  
  local_90 = (ms->window).base;
  uVar7 = (ms->window).dictLimit;
  local_58 = local_90 + uVar7;
  local_84 = (ms->cParams).minMatch;
  if (5 < local_84) {
    local_84 = 6;
  }
  if (local_84 < 5) {
    local_84 = 4;
  }
  local_a4 = (ms->cParams).searchLog;
  uVar13 = 6;
  if (local_a4 < 6) {
    uVar13 = local_a4;
  }
  if (uVar13 < 5) {
    uVar13 = 4;
  }
  ip = (ulong *)((ulong)((int)src == (int)local_58) + (long)src);
  uVar24 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar18 = (int)ip - (int)local_90;
  local_60 = *rep;
  local_5c = iVar18 - uVar24;
  if (iVar18 - uVar7 <= uVar24) {
    local_5c = uVar7;
  }
  uVar24 = 0;
  if (ms->loadedDictEnd != 0) {
    local_5c = uVar7;
  }
  local_64 = rep[1];
  local_5c = iVar18 - local_5c;
  uVar7 = local_64;
  if (local_5c < local_64) {
    uVar7 = uVar24;
  }
  uVar9 = local_60;
  if (local_5c < local_60) {
    uVar9 = uVar24;
  }
  uVar29 = (ulong)uVar9;
  ms->lazySkipping = 0;
  local_80 = (ulong *)((long)src + (srcSize - 0x10));
  uVar14 = ms->nextToUpdate;
  uVar23 = (ulong)uVar14;
  uVar11 = ((int)local_80 - (int)(local_90 + uVar23)) + 1;
  uVar28 = 8;
  if (uVar11 < 8) {
    uVar28 = uVar11;
  }
  if (local_80 < local_90 + uVar23) {
    uVar28 = uVar24;
  }
  bVar8 = (byte)uVar13;
  local_40 = rep;
  if (uVar14 < uVar28 + uVar14) {
    UVar4 = ms->rowHashLog;
    local_98 = (ulong *)srcSize;
    if (0x20 < UVar4 + 8) {
LAB_0015f8aa:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    pUVar5 = ms->hashTable;
    pBVar17 = ms->tagTable;
    uVar25 = ms->hashSalt;
    local_70 = CONCAT44(local_70._4_4_,0x18 - UVar4);
    local_a0 = (ulong *)0xcf1bbcdcbf9b0000;
    do {
      if (local_84 == 5) {
        uVar19 = *(long *)(local_90 + uVar23) * -0x30e4432345000000;
LAB_0015ee39:
        uVar24 = (uint)((uVar19 ^ uVar25) >> (0x38U - (char)UVar4 & 0x3f));
      }
      else {
        if (local_84 == 6) {
          uVar19 = *(long *)(local_90 + uVar23) * -0x30e4432340650000;
          goto LAB_0015ee39;
        }
        uVar24 = (*(int *)(local_90 + uVar23) * -0x61c8864f ^ (uint)uVar25) >>
                 ((byte)(0x18 - UVar4) & 0x1f);
      }
      uVar11 = (uVar24 >> 8) << (bVar8 & 0x1f);
      if (((ulong)(pUVar5 + uVar11) & 0x3f) != 0) {
LAB_0015f793:
        __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a2,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      if (((ulong)(pBVar17 + uVar11) & ~(-1L << (bVar8 & 0x3f))) != 0) {
LAB_0015f7b2:
        __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a3,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      ms->hashCache[(uint)uVar23 & 7] = uVar24;
      uVar23 = uVar23 + 1;
    } while (uVar28 + uVar14 != uVar23);
  }
  puVar27 = (ulong *)(srcSize + (long)src);
  if (ip < local_80) {
    puVar1 = (ulong *)((long)puVar27 - 7);
    local_48 = (ulong *)((long)puVar27 + -3);
    local_50 = (ulong *)((long)puVar27 + -1);
    puVar26 = puVar27 + -4;
    local_70 = ~(-1L << (bVar8 & 0x3f));
    local_a0 = puVar26;
    local_98 = puVar27;
    do {
      uVar24 = (uint)uVar29;
      if ((uVar24 == 0) || (*(int *)(((long)ip + 1) - uVar29) != *(int *)((long)ip + 1))) {
        local_b0 = 999999999;
        if (local_84 == 6) {
          if (uVar13 == 6) {
            uVar23 = ZSTD_RowFindBestMatch_noDict_6_6(ms,(BYTE *)ip,(BYTE *)puVar27,&local_b0);
          }
          else if (uVar13 == 5) {
            uVar23 = ZSTD_RowFindBestMatch_noDict_6_5(ms,(BYTE *)ip,(BYTE *)puVar27,&local_b0);
          }
          else {
            uVar23 = ZSTD_RowFindBestMatch_noDict_6_4(ms,(BYTE *)ip,(BYTE *)puVar27,&local_b0);
          }
        }
        else if (local_84 == 5) {
          if (uVar13 == 6) {
            uVar23 = ZSTD_RowFindBestMatch_noDict_5_6(ms,(BYTE *)ip,(BYTE *)puVar27,&local_b0);
          }
          else if (uVar13 == 5) {
            uVar23 = ZSTD_RowFindBestMatch_noDict_5_5(ms,(BYTE *)ip,(BYTE *)puVar27,&local_b0);
          }
          else {
            uVar23 = ZSTD_RowFindBestMatch_noDict_5_4(ms,(BYTE *)ip,(BYTE *)puVar27,&local_b0);
          }
        }
        else if (uVar13 == 6) {
          uVar23 = ZSTD_RowFindBestMatch_noDict_4_6(ms,(BYTE *)ip,(BYTE *)puVar27,&local_b0);
        }
        else if (uVar13 == 5) {
          uVar23 = ZSTD_RowFindBestMatch_noDict_4_5(ms,(BYTE *)ip,(BYTE *)puVar27,&local_b0);
        }
        else {
          uVar23 = ZSTD_RowFindBestMatch_noDict_4_4(ms,(BYTE *)ip,(BYTE *)puVar27,&local_b0);
        }
        uVar25 = local_b0;
        if (uVar23 == 0) {
          uVar25 = 1;
        }
        puVar26 = local_a0;
        puVar27 = local_98;
        if (3 < uVar23) {
          if (3 < local_b0) {
            if ((src < ip) && (local_58 < (BYTE *)((long)ip + (3 - local_b0)))) {
              puVar16 = ip;
              while (ip = puVar16,
                    *(char *)((long)puVar16 - 1) == *(char *)((long)puVar16 + (2 - local_b0))) {
                ip = (ulong *)((long)puVar16 - 1);
                uVar23 = uVar23 + 1;
                if ((ip <= src) ||
                   (pBVar17 = (BYTE *)((long)puVar16 + (2 - local_b0)), puVar16 = ip,
                   pBVar17 <= local_58)) break;
              }
            }
            uVar29 = (ulong)((int)uVar25 - 3);
            uVar7 = uVar24;
          }
          goto LAB_0015f0de;
        }
        uVar23 = (long)ip - (long)src;
        ip = (ulong *)((long)ip + (uVar23 >> 8) + 1);
        ms->lazySkipping = (uint)(0x7ff < uVar23);
      }
      else {
        lVar12 = -uVar29;
        puVar16 = (ulong *)((long)ip + 5);
        puVar10 = (ulong *)((long)ip + lVar12 + 5);
        puVar20 = puVar16;
        if (puVar16 < puVar1) {
          if (*puVar10 == *puVar16) {
            lVar21 = 0;
            do {
              puVar20 = (ulong *)((long)ip + lVar21 + 0xd);
              if (puVar1 <= puVar20) {
                puVar10 = (ulong *)((long)ip + lVar12 + lVar21 + 0xd);
                puVar20 = (ulong *)((long)ip + lVar21 + 0xd);
                goto LAB_0015f08f;
              }
              uVar23 = *(ulong *)((long)ip + lVar21 + lVar12 + 0xd);
              uVar25 = *puVar20;
              lVar21 = lVar21 + 8;
            } while (uVar23 == uVar25);
            uVar25 = uVar25 ^ uVar23;
            uVar23 = 0;
            if (uVar25 != 0) {
              for (; (uVar25 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
              }
            }
            uVar23 = (uVar23 >> 3 & 0x1fffffff) + lVar21;
          }
          else {
            uVar25 = *puVar16 ^ *puVar10;
            uVar23 = 0;
            if (uVar25 != 0) {
              for (; (uVar25 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
              }
            }
            uVar23 = uVar23 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_0015f08f:
          if ((puVar20 < local_48) && ((int)*puVar10 == (int)*puVar20)) {
            puVar20 = (ulong *)((long)puVar20 + 4);
            puVar10 = (ulong *)((long)puVar10 + 4);
          }
          if ((puVar20 < local_50) && ((short)*puVar10 == (short)*puVar20)) {
            puVar20 = (ulong *)((long)puVar20 + 2);
            puVar10 = (ulong *)((long)puVar10 + 2);
          }
          if (puVar20 < puVar27) {
            puVar20 = (ulong *)((long)puVar20 + (ulong)((char)*puVar10 == (char)*puVar20));
          }
          uVar23 = (long)puVar20 - (long)puVar16;
        }
        uVar23 = uVar23 + 4;
        uVar25 = 1;
        ip = (ulong *)((long)ip + 1);
LAB_0015f0de:
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_0015f84d:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
LAB_0015f80f:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar19 = (long)ip - (long)src;
        puVar16 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar16 + uVar19)) {
LAB_0015f7d1:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (puVar27 < ip) {
LAB_0015f7f0:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (puVar26 < ip) {
          local_78 = uVar25;
          ZSTD_safecopyLiterals((BYTE *)puVar16,(BYTE *)src,(BYTE *)ip,(BYTE *)puVar26);
          puVar26 = local_a0;
          puVar27 = local_98;
LAB_0015f165:
          seqStore->lit = seqStore->lit + uVar19;
          uVar25 = local_78;
          if (0xffff < uVar19) {
            if (seqStore->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46a0,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar15 = *(ulong *)((long)src + 8);
          *puVar16 = *src;
          puVar16[1] = uVar15;
          pBVar17 = seqStore->lit;
          if (0x10 < uVar19) {
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar17 + 0x10) + (-0x10 - ((long)src + 0x10))))
            {
              local_78 = uVar25;
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar15 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar17 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar17 + 0x18) = uVar15;
            local_78 = uVar25;
            if (0x20 < (long)uVar19) {
              lVar12 = 0;
              do {
                puVar3 = (undefined8 *)((long)src + lVar12 + 0x20);
                uVar6 = puVar3[1];
                pBVar2 = pBVar17 + lVar12 + 0x20;
                *(undefined8 *)pBVar2 = *puVar3;
                *(undefined8 *)(pBVar2 + 8) = uVar6;
                puVar3 = (undefined8 *)((long)src + lVar12 + 0x30);
                uVar6 = puVar3[1];
                *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                *(undefined8 *)(pBVar2 + 0x18) = uVar6;
                lVar12 = lVar12 + 0x20;
              } while (pBVar2 + 0x20 < pBVar17 + uVar19);
            }
            goto LAB_0015f165;
          }
          seqStore->lit = pBVar17 + uVar19;
        }
        psVar22 = seqStore->sequences;
        psVar22->litLength = (U16)uVar19;
        psVar22->offBase = (U32)uVar25;
        if (uVar23 < 3) {
LAB_0015f82e:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar23 - 3) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_0015f86c:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar22 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar22->mlBase = (U16)(uVar23 - 3);
        psVar22 = psVar22 + 1;
        seqStore->sequences = psVar22;
        if (ms->lazySkipping != 0) {
          uVar24 = ms->nextToUpdate;
          uVar25 = (ulong)uVar24;
          uVar9 = ((int)local_80 - (int)(local_90 + uVar25)) + 1;
          if (7 < uVar9) {
            uVar9 = 8;
          }
          if (local_80 < local_90 + uVar25) {
            uVar9 = 0;
          }
          local_38 = uVar23;
          if (uVar24 < uVar9 + uVar24) {
            UVar4 = ms->rowHashLog;
            if (0x20 < UVar4 + 8) goto LAB_0015f8aa;
            pUVar5 = ms->hashTable;
            pBVar17 = ms->tagTable;
            uVar19 = ms->hashSalt;
            local_78 = CONCAT44(local_78._4_4_,0x18 - UVar4);
            do {
              if (local_84 == 5) {
                uVar15 = *(long *)(local_90 + uVar25) * -0x30e4432345000000;
LAB_0015f340:
                uVar14 = (uint)((uVar15 ^ uVar19) >> (0x38U - (char)UVar4 & 0x3f));
              }
              else {
                if (local_84 == 6) {
                  uVar15 = *(long *)(local_90 + uVar25) * -0x30e4432340650000;
                  goto LAB_0015f340;
                }
                uVar14 = (*(int *)(local_90 + uVar25) * -0x61c8864f ^ (uint)uVar19) >>
                         ((byte)(0x18 - UVar4) & 0x1f);
              }
              uVar28 = (uVar14 >> 8) << (bVar8 & 0x1f);
              if (((ulong)(pUVar5 + uVar28) & 0x3f) != 0) goto LAB_0015f793;
              if ((local_70 & (ulong)(pBVar17 + uVar28)) != 0) goto LAB_0015f7b2;
              ms->hashCache[(uint)uVar25 & 7] = uVar14;
              uVar25 = uVar25 + 1;
            } while (uVar9 + uVar24 != uVar25);
          }
          ms->lazySkipping = 0;
          puVar26 = local_a0;
          puVar27 = local_98;
        }
        ip = (ulong *)((long)ip + uVar23);
        src = ip;
        if ((uVar7 != 0) && (ip <= local_80)) {
          uVar23 = (ulong)uVar7;
          while( true ) {
            uVar25 = uVar23;
            uVar23 = uVar29;
            uVar24 = (uint)uVar23;
            src = ip;
            uVar29 = uVar23;
            uVar7 = (uint)uVar25;
            if ((int)*ip != *(int *)((long)ip - uVar25)) break;
            lVar12 = -uVar25;
            puVar16 = (ulong *)((long)ip + 4);
            puVar10 = (ulong *)((long)ip + lVar12 + 4);
            puVar20 = puVar16;
            if (puVar16 < puVar1) {
              if (*puVar10 == *puVar16) {
                lVar21 = 0;
                do {
                  puVar20 = (ulong *)((long)ip + lVar21 + 0xc);
                  puVar26 = local_a0;
                  if (puVar1 <= puVar20) {
                    puVar10 = (ulong *)((long)ip + lVar12 + lVar21 + 0xc);
                    puVar20 = (ulong *)((long)ip + lVar21 + 0xc);
                    goto LAB_0015f4a4;
                  }
                  uVar29 = *(ulong *)((long)ip + lVar21 + lVar12 + 0xc);
                  uVar19 = *puVar20;
                  lVar21 = lVar21 + 8;
                } while (uVar29 == uVar19);
                uVar19 = uVar19 ^ uVar29;
                uVar29 = 0;
                if (uVar19 != 0) {
                  for (; (uVar19 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                  }
                }
                uVar29 = (uVar29 >> 3 & 0x1fffffff) + lVar21;
              }
              else {
                uVar19 = *puVar16 ^ *puVar10;
                uVar29 = 0;
                if (uVar19 != 0) {
                  for (; (uVar19 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                  }
                }
                uVar29 = uVar29 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0015f4a4:
              if ((puVar20 < local_48) && ((int)*puVar10 == (int)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 4);
                puVar10 = (ulong *)((long)puVar10 + 4);
              }
              if ((puVar20 < local_50) && ((short)*puVar10 == (short)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 2);
                puVar10 = (ulong *)((long)puVar10 + 2);
              }
              if (puVar20 < puVar27) {
                puVar20 = (ulong *)((long)puVar20 + (ulong)((char)*puVar10 == (char)*puVar20));
              }
              uVar29 = (long)puVar20 - (long)puVar16;
            }
            if (seqStore->maxNbSeq <= (ulong)((long)psVar22 - (long)seqStore->sequencesStart >> 3))
            goto LAB_0015f84d;
            if (0x20000 < seqStore->maxNbLit) goto LAB_0015f80f;
            puVar16 = (ulong *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < puVar16) goto LAB_0015f7d1;
            if (puVar27 < ip) goto LAB_0015f7f0;
            if (puVar26 < ip) {
              ZSTD_safecopyLiterals((BYTE *)puVar16,(BYTE *)ip,(BYTE *)ip,(BYTE *)puVar26);
              puVar26 = local_a0;
              puVar27 = local_98;
            }
            else {
              uVar19 = ip[1];
              *puVar16 = *ip;
              puVar16[1] = uVar19;
            }
            psVar22 = seqStore->sequences;
            psVar22->litLength = 0;
            psVar22->offBase = 1;
            if (uVar29 + 4 < 3) goto LAB_0015f82e;
            if (0xffff < uVar29 + 1) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0015f86c;
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar22 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar22->mlBase = (U16)(uVar29 + 1);
            psVar22 = psVar22 + 1;
            seqStore->sequences = psVar22;
            ip = (ulong *)((long)ip + uVar29 + 4);
            src = ip;
            uVar29 = uVar25;
            uVar7 = uVar24;
            if ((uVar24 == 0) || (local_80 < ip)) break;
          }
        }
      }
      uVar9 = (uint)uVar29;
    } while (ip < local_80);
  }
  if (local_64 <= local_5c) {
    local_64 = 0;
  }
  uVar13 = local_64;
  if (uVar9 != 0) {
    uVar13 = local_60;
  }
  if (local_60 <= local_5c) {
    uVar13 = local_64;
    local_60 = 0;
  }
  if (uVar9 != 0) {
    local_60 = uVar9;
  }
  if (uVar7 != 0) {
    uVar13 = uVar7;
  }
  *local_40 = local_60;
  local_40[1] = uVar13;
  return (long)puVar27 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 0, ZSTD_noDict);
}